

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_find_polygon_degeneracies.cc
# Opt level: O3

vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_> *
s2builderutil::FindPolygonDegeneracies
          (vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
           *__return_storage_ptr__,Graph *g,S2Error *error)

{
  pair<int,_bool> *ppVar1;
  pointer *ppPVar2;
  S2Point *pSVar3;
  double *pdVar4;
  double dVar5;
  pair<int,_int> pVar6;
  pointer pVVar7;
  pointer pPVar8;
  iterator __position;
  pointer pcVar9;
  double dVar10;
  double dVar11;
  PolygonDegeneracy *pPVar12;
  S2Error *pSVar13;
  pointer pSVar14;
  Graph *pGVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  PolygonDegeneracy PVar20;
  int iVar21;
  ulong uVar22;
  pointer pCVar23;
  pointer pCVar24;
  Graph *pGVar25;
  pointer ppVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  PolygonDegeneracy PVar30;
  uint uVar31;
  EdgeId e;
  uint uVar32;
  ulong uVar33;
  PolygonDegeneracy *d;
  ulong uVar34;
  pointer pPVar35;
  pointer pCVar36;
  pointer pSVar37;
  int *piVar38;
  uint uVar39;
  uint uVar40;
  pointer pCVar41;
  vector<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
  components;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> crossing_edges;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> frontier;
  S2CrossingEdgeQuery query;
  int local_2cc;
  pointer local_2c8;
  int local_29c;
  __uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_> local_290;
  undefined1 local_288 [12];
  undefined4 uStack_27c;
  Vector3_d VStack_278;
  bool local_260;
  VType local_258;
  VType VStack_250;
  VType local_248;
  VType VStack_240;
  VType local_238;
  VType VStack_230;
  S2Point *local_228;
  int local_220;
  vector<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
  local_218;
  long local_200;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> local_1f8;
  ulong local_1d8;
  ulong local_1d0;
  MutableS2ShapeIndex local_1c8;
  S2CrossingEdgeQuery local_168;
  DegeneracyFinder local_110;
  S2LogMessage local_40;
  
  anon_unknown_0::CheckGraphOptions(g);
  if ((g->options_).sibling_pairs_ == DISCARD && (g->options_).degenerate_edges_ == DISCARD) {
    (__return_storage_ptr__->
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  local_110.g_ = g;
  S2Builder::Graph::VertexInMap::VertexInMap(&local_110.in_,g);
  S2Builder::Graph::VertexOutMap::VertexOutMap(&local_110.out_,local_110.g_);
  local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_110.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_110.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_110.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_110.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_110.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_110.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_110.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_110.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_110.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_110.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  std::vector<bool,_std::allocator<bool>_>::resize
            (&local_110.is_edge_degeneracy_,
             (long)(int)((ulong)((long)((local_110.g_)->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)((local_110.g_)->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3),false);
  std::vector<bool,_std::allocator<bool>_>::resize
            (&local_110.is_vertex_unbalanced_,(long)(local_110.g_)->num_vertices_,false);
  ppVar26 = ((local_110.g_)->edges_->
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar31 = (uint)((ulong)((long)((local_110.g_)->edges_->
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar26) >> 3);
  if (0 < (int)uVar31) {
    uVar22 = 0;
    uVar39 = 0;
    uVar32 = 0;
    do {
      pVar6 = ppVar26[uVar22];
      iVar27 = pVar6.first;
      iVar19 = pVar6.second;
      if (iVar27 == iVar19) {
LAB_001caed0:
        local_110.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar22 >> 6 & 0x3ffffff] =
             local_110.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [uVar22 >> 6 & 0x3ffffff] | 1L << ((byte)uVar22 & 0x3f);
        uVar32 = uVar32 + 1;
      }
      else {
        uVar40 = uVar39;
        if ((int)uVar39 < (int)uVar31) {
          piVar38 = local_110.in_.in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start + (int)uVar39;
          lVar28 = (long)(int)uVar39 << 0x20;
          do {
            if ((iVar27 <= ppVar26[*piVar38].second) &&
               ((iVar27 < ppVar26[*piVar38].second || (iVar19 <= ppVar26[*piVar38].first)))) {
              iVar21 = *(int *)((long)local_110.in_.in_edge_ids_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + (lVar28 >> 0x1e));
              uVar40 = uVar39;
              if ((ppVar26[iVar21].second == iVar27) && (ppVar26[iVar21].first == iVar19))
              goto LAB_001caed0;
              break;
            }
            lVar28 = lVar28 + 0x100000000;
            uVar39 = uVar39 + 1;
            piVar38 = piVar38 + 1;
            uVar40 = uVar31;
          } while (uVar31 != uVar39);
        }
        iVar19 = iVar27 + 0x3f;
        if (-1 < iVar27) {
          iVar19 = iVar27;
        }
        local_110.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
        [(long)(iVar19 >> 6) +
         ((ulong)(((long)iVar27 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
             local_110.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [(long)(iVar19 >> 6) +
              ((ulong)(((long)iVar27 & 0x800000000000003fU) < 0x8000000000000001) - 1)] |
             1L << ((byte)pVar6.first & 0x3f);
        uVar39 = uVar40;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != (uVar31 & 0x7fffffff));
    if (uVar32 != 0) {
      if (uVar32 == uVar31) {
        local_288._0_8_ = error;
        if (((local_110.g_)->is_full_polygon_predicate_).super__Function_base._M_manager ==
            (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar16 = (*((local_110.g_)->is_full_polygon_predicate_)._M_invoker)
                           ((_Any_data *)&(local_110.g_)->is_full_polygon_predicate_,local_110.g_,
                            (S2Error **)local_288);
        std::
        vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
        ::vector(__return_storage_ptr__,
                 (long)(int)((ulong)((long)((local_110.g_)->edges_->
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)((local_110.g_)->edges_->
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 3),
                 (allocator_type *)local_288);
        unique0x100025cf = (ostream *)CONCAT44(uStack_27c,local_288._8_4_);
        VStack_278.c_[0] = (VType)CONCAT44(VStack_278.c_[0]._4_4_,VStack_278.c_[0]._0_4_);
        if (0 < (int)((ulong)((long)((local_110.g_)->edges_->
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)((local_110.g_)->edges_->
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
          lVar28 = 0;
          do {
            (__return_storage_ptr__->
            super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
            )._M_impl.super__Vector_impl_data._M_start[lVar28] =
                 (PolygonDegeneracy)((uint)bVar16 * -0x80000000 + (int)lVar28);
            lVar28 = lVar28 + 1;
            unique0x100025e7 = (ostream *)CONCAT44(uStack_27c,local_288._8_4_);
            VStack_278.c_[0] = (VType)CONCAT44(VStack_278.c_[0]._4_4_,VStack_278.c_[0]._0_4_);
          } while (lVar28 < (int)((ulong)((long)((local_110.g_)->edges_->
                                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)((local_110.g_)->edges_->
                                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start) >> 3));
        }
      }
      else {
        local_218.
        super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_218.
        super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_218.
        super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<bool,_std::allocator<bool>_>::resize
                  (&local_110.is_vertex_used_,(long)(local_110.g_)->num_vertices_,false);
        ppVar26 = ((local_110.g_)->edges_->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)((local_110.g_)->edges_->
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar26) >> 3) <
            1) {
          (__return_storage_ptr__->
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        else {
          uVar22 = 0xffffffff;
          local_2c8 = (pointer)0x0;
          uVar33 = 0;
          local_29c = 0;
          local_2cc = 0;
          pGVar25 = local_110.g_;
          do {
            if ((local_110.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [uVar33 >> 6 & 0x3ffffff] >> (uVar33 & 0x3f) & 1) != 0) {
              PVar20 = (PolygonDegeneracy)ppVar26[uVar33].first;
              uVar29 = (ulong)(int)PVar20;
              PVar30 = (PolygonDegeneracy)((int)PVar20 + 0x3f);
              if (-1 < (long)uVar29) {
                PVar30 = PVar20;
              }
              uVar34 = (ulong)((uVar29 & 0x800000000000003f) < 0x8000000000000001);
              if ((local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [(long)((int)PVar30 >> 6) + (uVar34 - 1)] >> (uVar29 & 0x3f) & 1) == 0) {
                VStack_278.c_[0]._4_4_ = 0;
                VStack_278.c_[1] = 0.0;
                local_288._4_4_ = 0;
                local_288._8_4_ = 0;
                uStack_27c = 0;
                VStack_278.c_[0]._0_4_ = 0;
                local_1c8.super_S2ShapeIndex._vptr_S2ShapeIndex = (_func_int **)0x0;
                local_1c8.shapes_.
                super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_1c8.shapes_.
                super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_168.index_ = (S2ShapeIndex *)CONCAT35(local_168.index_._5_3_,0x100000000);
                local_168.index_ = (S2ShapeIndex *)CONCAT44(local_168.index_._4_4_,PVar20);
                local_288._0_4_ = PVar20;
                local_1d8 = uVar33;
                local_1d0 = uVar29;
                std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::
                _M_realloc_insert<std::pair<int,bool>>
                          ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>> *)
                           &local_1c8,(iterator)0x0,(pair<int,_bool> *)&local_168);
                local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [(long)((int)PVar30 >> 6) + (uVar34 - 1)] =
                     local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [(long)((int)PVar30 >> 6) + (uVar34 - 1)] | 1L << (PVar20._0_1_ & 0x3f);
                while ((pointer)local_1c8.super_S2ShapeIndex._vptr_S2ShapeIndex !=
                       local_1c8.shapes_.
                       super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
                  ppVar1 = (pair<int,_bool> *)
                           (local_1c8.shapes_.
                            super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + -1);
                  iVar27 = ((pair<int,_bool> *)
                           (local_1c8.shapes_.
                            super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + -1))->first;
                  uVar33 = (ulong)iVar27;
                  bVar16 = ((pair<int,_bool> *)
                           (local_1c8.shapes_.
                            super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + -1))->second;
                  local_1c8.shapes_.
                  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar1;
                  if (local_288._4_4_ == 0) {
                    iVar19 = iVar27 + 0x3f;
                    if (-1 < iVar27) {
                      iVar19 = iVar27;
                    }
                    if ((local_110.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>.
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [(long)(iVar19 >> 6) +
                          ((ulong)((uVar33 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                         (uVar33 & 0x3f) & 1) != 0) {
                      iVar19 = anon_unknown_0::DegeneracyFinder::ContainsVertexSign
                                         (&local_110,iVar27);
                      if (iVar19 == 0) {
                        S2LogMessage::S2LogMessage
                                  ((S2LogMessage *)&local_168,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_find_polygon_degeneracies.cc"
                                   ,0xe2,kFatal,(ostream *)&std::cerr);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_168.a0_.c_[0],"Check failed: (v0_sign) != (0) ",
                                   0x1f);
                        goto LAB_001cbe06;
                      }
                      local_288._4_4_ = -iVar19;
                      if (bVar16 != false) {
                        local_288._4_4_ = iVar19;
                      }
                    }
                  }
                  uVar29 = (ulong)local_110.out_.edge_begins_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar33];
                  local_200 = CONCAT44(local_200._4_4_,
                                       local_110.out_.edge_begins_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar33 + 1]);
                  if (local_110.out_.edge_begins_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar33] !=
                      local_110.out_.edge_begins_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar33 + 1]) {
                    do {
                      iVar19 = ((local_110.g_)->edges_->
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar29].second;
                      bVar18 = anon_unknown_0::DegeneracyFinder::CrossingParity
                                         (&local_110,iVar27,iVar19,false);
                      uVar31 = (uint)uVar29;
                      uVar39 = uVar31 + 0x3f;
                      if (-1 < (int)uVar31) {
                        uVar39 = uVar31;
                      }
                      if ((local_110.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>.
                           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [(long)((int)uVar39 >> 6) +
                            ((ulong)((uVar29 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                           (uVar29 & 0x3f) & 1) != 0) {
                        PVar20 = (PolygonDegeneracy)
                                 ((uint)(bVar16 != bVar18) << 0x1f | uVar31 & 0x7fffffff);
                        local_168.index_ = (S2ShapeIndex *)CONCAT44(local_168.index_._4_4_,PVar20);
                        if (VStack_278.c_[0] == VStack_278.c_[1]) {
                          std::
                          vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                          ::_M_realloc_insert<s2builderutil::PolygonDegeneracy>
                                    ((vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                                      *)(local_288 + 8),(iterator)VStack_278.c_[0],
                                     (PolygonDegeneracy *)&local_168);
                        }
                        else {
                          *(PolygonDegeneracy *)VStack_278.c_[0] = PVar20;
                          VStack_278.c_[0] = (VType)((long)VStack_278.c_[0] + 4);
                        }
                      }
                      iVar21 = iVar19 + 0x3f;
                      if (-1 < iVar19) {
                        iVar21 = iVar19;
                      }
                      uVar33 = (ulong)(((long)iVar19 & 0x800000000000003fU) < 0x8000000000000001);
                      if ((local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>.
                           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [(long)(iVar21 >> 6) + (uVar33 - 1)] >> ((long)iVar19 & 0x3fU) & 1) == 0)
                      {
                        bVar17 = anon_unknown_0::DegeneracyFinder::CrossingParity
                                           (&local_110,iVar19,iVar27,true);
                        local_168.index_ =
                             (S2ShapeIndex *)
                             CONCAT44(CONCAT31(local_168.index_._5_3_,(bVar16 != bVar18) != bVar17),
                                      iVar19);
                        if (local_1c8.shapes_.
                            super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                            local_1c8.shapes_.
                            super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::
                          _M_realloc_insert<std::pair<int,bool>>
                                    ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>
                                      *)&local_1c8,
                                     (iterator)
                                     local_1c8.shapes_.
                                     super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (pair<int,_bool> *)&local_168);
                        }
                        else {
                          *local_1c8.shapes_.
                           super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start =
                               (unique_ptr<S2Shape,_std::default_delete<S2Shape>_>)local_168.index_;
                          local_1c8.shapes_.
                          super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               local_1c8.shapes_.
                               super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1;
                        }
                        local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>._M_impl
                        .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                        [(long)(iVar21 >> 6) + (uVar33 - 1)] =
                             local_110.is_vertex_used_.super__Bvector_base<std::allocator<bool>_>.
                             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             [(long)(iVar21 >> 6) + (uVar33 - 1)] | 1L << ((byte)iVar19 & 0x3f);
                      }
                      uVar29 = uVar29 + 1;
                    } while ((int)local_200 != (int)uVar29);
                  }
                }
                if ((pair<int,_bool> *)local_1c8.super_S2ShapeIndex._vptr_S2ShapeIndex !=
                    (pair<int,_bool> *)0x0) {
                  operator_delete(local_1c8.super_S2ShapeIndex._vptr_S2ShapeIndex);
                }
                pCVar41 = local_218.
                          super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar16 = local_288._4_4_ == 0;
                if (!bVar16) {
                  uVar22 = local_1d0;
                }
                uVar22 = uVar22 & 0xffffffff;
                if (!bVar16) {
                  local_2cc = local_288._4_4_;
                }
                if (local_2c8 ==
                    local_218.
                    super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  if ((long)local_2c8 -
                      (long)local_218.
                            super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                            ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
                    std::__throw_length_error("vector::_M_realloc_insert");
                  }
                  uVar29 = (long)local_2c8 -
                           (long)local_218.
                                 super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5;
                  uVar33 = uVar29;
                  if (local_2c8 ==
                      local_218.
                      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    uVar33 = 1;
                  }
                  uVar34 = uVar33 + uVar29;
                  if (0x3fffffffffffffe < uVar34) {
                    uVar34 = 0x3ffffffffffffff;
                  }
                  if (CARRY8(uVar33,uVar29)) {
                    uVar34 = 0x3ffffffffffffff;
                  }
                  if (uVar34 == 0) {
                    pCVar23 = (pointer)0x0;
                  }
                  else {
                    pCVar23 = (pointer)operator_new(uVar34 << 5);
                  }
                  pCVar36 = pCVar23 + uVar29;
                  pCVar36->root = local_288._0_4_;
                  pCVar36->root_sign = local_288._4_4_;
                  std::
                  vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ::vector(&pCVar36->degeneracies,
                           (vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                            *)(local_288 + 8));
                  pCVar36 = pCVar23;
                  for (pCVar24 = pCVar41; local_2c8 != pCVar24; pCVar24 = pCVar24 + 1) {
                    iVar27 = pCVar24->root_sign;
                    pCVar36->root = pCVar24->root;
                    pCVar36->root_sign = iVar27;
                    pPVar35 = (pCVar24->degeneracies).
                              super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    (pCVar36->degeneracies).
                    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pCVar24->degeneracies).
                         super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                    (pCVar36->degeneracies).
                    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                    ._M_impl.super__Vector_impl_data._M_finish = pPVar35;
                    (pCVar36->degeneracies).
                    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pCVar24->degeneracies).
                         super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    (pCVar24->degeneracies).
                    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    (pCVar24->degeneracies).
                    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    (pCVar24->degeneracies).
                    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    pCVar36 = pCVar36 + 1;
                  }
                  if (pCVar41 != (pointer)0x0) {
                    operator_delete(pCVar41);
                  }
                  local_218.
                  super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar23 + uVar34;
                  local_218.
                  super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                  ._M_impl.super__Vector_impl_data._M_start = pCVar23;
                }
                else {
                  local_2c8->root = local_288._0_4_;
                  local_2c8->root_sign = local_288._4_4_;
                  std::
                  vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ::vector(&local_2c8->degeneracies,
                           (vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                            *)(local_288 + 8));
                  pCVar36 = local_2c8;
                }
                local_218.
                super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish = pCVar36 + 1;
                local_2c8 = local_218.
                            super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                if ((void *)CONCAT44(uStack_27c,local_288._8_4_) != (void *)0x0) {
                  operator_delete((void *)CONCAT44(uStack_27c,local_288._8_4_));
                }
                local_29c = local_29c + (uint)bVar16;
                pGVar25 = local_110.g_;
                uVar33 = local_1d8;
              }
            }
            uVar33 = uVar33 + 1;
            ppVar26 = (pGVar25->edges_->
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          } while ((long)uVar33 <
                   (long)(int)((ulong)((long)(pGVar25->edges_->
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppVar26) >> 3));
          pCVar41 = local_218.
                    super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar12 = (PolygonDegeneracy *)VStack_278.c_[0];
          if (0 < local_29c) {
            if (local_2cc == 0) {
              if (0 < pGVar25->num_vertices_) {
                uVar22 = 0;
                do {
                  if ((local_110.is_vertex_unbalanced_.super__Bvector_base<std::allocator<bool>_>.
                       _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) {
                    local_2cc = anon_unknown_0::DegeneracyFinder::ContainsVertexSign
                                          (&local_110,(int)uVar22);
                    goto LAB_001cb6ec;
                  }
                  uVar31 = (int)uVar22 + 1;
                  uVar22 = (ulong)uVar31;
                } while (pGVar25->num_vertices_ != uVar31);
              }
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)local_288,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_find_polygon_degeneracies.cc"
                         ,0x118,kFatal,(ostream *)&std::cerr);
              std::operator<<((ostream *)CONCAT44(uStack_27c,local_288._8_4_),
                              "Could not find previously marked unbalanced vertex");
LAB_001cbe06:
              abort();
            }
LAB_001cb6ec:
            pCVar41 = local_218.
                      super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_29c < 0x15) {
              VStack_278.c_[0] = 0.0;
              VStack_278.c_[1] = 0.0;
              VStack_278.c_[2] = 0.0;
              local_258 = 0.0;
              VStack_250 = 0.0;
              local_248 = 0.0;
              VStack_240 = 0.0;
              local_238 = 0.0;
              VStack_230 = 0.0;
              pPVar12 = (PolygonDegeneracy *)0x0;
              if (local_218.
                  super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                  ._M_impl.super__Vector_impl_data._M_start != local_2c8) {
                pCVar23 = local_218.
                          super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  if (pCVar23->root_sign == 0) {
                    pVVar7 = ((local_110.g_)->vertices_->
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)
                             ._M_impl.super__Vector_impl_data._M_start;
                    local_288._0_8_ = pVVar7 + (int)uVar22;
                    unique0x00004a80 = (ostream *)(pVVar7 + pCVar23->root);
                    pcVar9 = (((S2Error *)local_288._0_8_)->text_)._M_dataplus._M_p;
                    dVar5 = (double)(((S2Error *)local_288._0_8_)->text_)._M_string_length;
                    VStack_278.c_[0] =
                         *(double *)&unique0x00004a80->field_0x10 * (double)pcVar9 -
                         dVar5 * *(double *)&unique0x00004a80->field_0x8;
                    VStack_278.c_[1] =
                         (double)unique0x00004a80->_vptr_basic_ostream * dVar5 -
                         *(double *)local_288._0_8_ * *(double *)&unique0x00004a80->field_0x10;
                    VStack_278.c_[2] =
                         *(double *)&unique0x00004a80->field_0x8 * *(double *)local_288._0_8_ -
                         (double)pcVar9 * (double)unique0x00004a80->_vptr_basic_ostream;
                    local_260 = false;
                    local_228 = (S2Point *)0x0;
                    ppVar26 = ((local_110.g_)->edges_->
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    bVar16 = 0 < local_2cc;
                    if (0 < (int)((ulong)((long)((local_110.g_)->edges_->
                                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)ppVar26) >> 3)) {
                      uVar33 = 0;
                      pGVar25 = local_110.g_;
                      do {
                        if ((local_110.is_edge_degeneracy_.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             [uVar33 >> 6 & 0x3ffffff] >> (uVar33 & 0x3f) & 1) == 0) {
                          pVVar7 = (pGVar25->vertices_->
                                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                          pSVar3 = pVVar7 + ppVar26[uVar33].first;
                          iVar27 = ppVar26[uVar33].second;
                          if (local_228 != pSVar3) {
                            bVar18 = S2::IsUnitLength(pSVar3);
                            if (!bVar18) {
                              S2LogMessage::S2LogMessage
                                        ((S2LogMessage *)&local_1c8,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
                                         ,0x102,kFatal,(ostream *)&std::cerr);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)
                                         local_1c8.shapes_.
                                         super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                         "Check failed: S2::IsUnitLength(*c) ",0x23);
                              goto LAB_001cbe06;
                            }
                            local_228 = pSVar3;
                            local_220 = s2pred::TriageSign((S2Point *)local_288._0_8_,
                                                           (S2Point *)stack0xfffffffffffffd80,pSVar3
                                                           ,&VStack_278);
                            local_220 = -local_220;
                          }
                          bVar18 = S2EdgeCrosser::EdgeOrVertexCrossing
                                             ((S2EdgeCrosser *)local_288,pVVar7 + iVar27);
                          bVar16 = (bool)(bVar18 ^ bVar16);
                          pGVar25 = local_110.g_;
                        }
                        uVar33 = uVar33 + 1;
                        ppVar26 = (pGVar25->edges_->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start;
                      } while ((long)uVar33 <
                               (long)(int)((ulong)((long)(pGVar25->edges_->
                                                                                                                  
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)ppVar26) >> 3));
                    }
                    pCVar23->root_sign = bVar16 - 1 | 1;
                  }
                  pCVar23 = pCVar23 + 1;
                  pPVar12 = (PolygonDegeneracy *)VStack_278.c_[0];
                } while (pCVar23 != local_2c8);
              }
            }
            else {
              MutableS2ShapeIndex::MutableS2ShapeIndex(&local_1c8);
              pGVar15 = local_110.g_;
              local_290._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
              super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
                   (tuple<S2Shape_*,_std::default_delete<S2Shape>_>)operator_new(0x18);
              *(undefined4 *)
               ((long)local_290._M_t.
                      super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                      super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 8) = 0xffffffff;
              *(undefined ***)
               local_290._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
               super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl = &PTR__S2Shape_002bb430;
              *(Graph **)
               ((long)local_290._M_t.
                      super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                      super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x10) = pGVar15;
              MutableS2ShapeIndex::Add
                        (&local_1c8,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_290
                        );
              if ((_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)
                  local_290._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                  super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl != (S2Shape *)0x0) {
                (**(code **)(*(long *)local_290._M_t.
                                      super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>
                                      .super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 8))();
              }
              local_290._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
              super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
                   (tuple<S2Shape_*,_std::default_delete<S2Shape>_>)
                   (_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)0x0;
              local_168.tmp_candidates_.
              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_168.tmp_candidates_.
              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.tmp_candidates_.
              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.index_ = (S2ShapeIndex *)0x0;
              local_168.a0_.c_[0] = 0.0;
              local_168.a0_.c_[1] = 0.0;
              local_168.a1_.c_[0] = 0.0;
              local_168.a1_.c_[1] = 0.0;
              local_168.iter_.iter_._M_t.
              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
              ._M_t.
              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl =
                   (unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                    )(__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
                      )0x0;
              S2CrossingEdgeQuery::Init(&local_168,&local_1c8.super_S2ShapeIndex);
              pCVar41 = local_218.
                        super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_1f8.
              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1f8.
              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1f8.
              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              VStack_278.c_[2] = 0.0;
              VStack_278.c_[0] = 0.0;
              VStack_278.c_[1] = 0.0;
              local_258 = 0.0;
              VStack_250 = 0.0;
              local_248 = 0.0;
              VStack_240 = 0.0;
              local_238 = 0.0;
              VStack_230 = 0.0;
              pPVar12 = (PolygonDegeneracy *)0x0;
              if (local_218.
                  super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                  ._M_impl.super__Vector_impl_data._M_start != local_2c8) {
                local_200 = (long)(int)uVar22 * 0x18;
                pCVar23 = local_218.
                          super__Vector_base<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  if (pCVar23->root_sign == 0) {
                    pVVar7 = ((local_110.g_)->vertices_->
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)
                             ._M_impl.super__Vector_impl_data._M_start;
                    local_288._0_8_ = (long)pVVar7->c_ + local_200;
                    unique0x00004a80 = (ostream *)(pVVar7 + pCVar23->root);
                    dVar5 = *(double *)((long)pVVar7->c_ + local_200);
                    pdVar4 = (double *)((long)pVVar7->c_ + local_200 + 8);
                    dVar10 = *pdVar4;
                    dVar11 = pdVar4[1];
                    VStack_278.c_[0] =
                         *(double *)&unique0x00004a80->field_0x10 * dVar10 -
                         dVar11 * *(double *)&unique0x00004a80->field_0x8;
                    VStack_278.c_[1] =
                         (double)unique0x00004a80->_vptr_basic_ostream * dVar11 -
                         dVar5 * *(double *)&unique0x00004a80->field_0x10;
                    VStack_278.c_[2] =
                         *(double *)&unique0x00004a80->field_0x8 * dVar5 -
                         dVar10 * (double)unique0x00004a80->_vptr_basic_ostream;
                    local_260 = false;
                    local_228 = (S2Point *)0x0;
                    pVVar7 = ((local_110.g_)->vertices_->
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)
                             ._M_impl.super__Vector_impl_data._M_start;
                    S2CrossingEdgeQuery::GetCandidates
                              (&local_168,(S2Point *)((long)pVVar7->c_ + local_200),
                               pVVar7 + pCVar23->root,
                               (S2Shape *)
                               *(pair<int,_bool> *)
                                local_1c8.shapes_.
                                super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,&local_1f8);
                    pSVar14 = local_1f8.
                              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    bVar16 = 0 < local_2cc;
                    for (pSVar37 = local_1f8.
                                   super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                                   ._M_impl.super__Vector_impl_data._M_start; pSVar37 != pSVar14;
                        pSVar37 = pSVar37 + 1) {
                      iVar27 = pSVar37->edge_id;
                      uVar22 = (ulong)iVar27;
                      iVar19 = iVar27 + 0x3f;
                      if (-1 < (long)uVar22) {
                        iVar19 = iVar27;
                      }
                      if ((local_110.is_edge_degeneracy_.super__Bvector_base<std::allocator<bool>_>.
                           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [(long)(iVar19 >> 6) +
                            ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                           (uVar22 & 0x3f) & 1) == 0) {
                        ppVar26 = ((local_110.g_)->edges_->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start;
                        pVVar7 = ((local_110.g_)->vertices_->
                                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        pSVar3 = pVVar7 + ppVar26[uVar22].first;
                        iVar27 = ppVar26[uVar22].second;
                        if (local_228 != pSVar3) {
                          bVar18 = S2::IsUnitLength(pSVar3);
                          if (!bVar18) {
                            S2LogMessage::S2LogMessage
                                      (&local_40,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
                                       ,0x102,kFatal,(ostream *)&std::cerr);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (local_40.stream_,"Check failed: S2::IsUnitLength(*c) ",0x23);
                            goto LAB_001cbe06;
                          }
                          local_228 = pSVar3;
                          local_220 = s2pred::TriageSign((S2Point *)local_288._0_8_,
                                                         (S2Point *)stack0xfffffffffffffd80,pSVar3,
                                                         &VStack_278);
                          local_220 = -local_220;
                        }
                        bVar18 = S2EdgeCrosser::EdgeOrVertexCrossing
                                           ((S2EdgeCrosser *)local_288,pVVar7 + iVar27);
                        bVar16 = (bool)(bVar18 ^ bVar16);
                      }
                    }
                    pCVar23->root_sign = bVar16 - 1 | 1;
                  }
                  pCVar23 = pCVar23 + 1;
                } while (pCVar23 != local_2c8);
                pPVar12 = (PolygonDegeneracy *)VStack_278.c_[0];
                if (local_1f8.
                    super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1f8.
                                  super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                  pPVar12 = (PolygonDegeneracy *)VStack_278.c_[0];
                }
              }
              VStack_278.c_[0] = (VType)pPVar12;
              S2CrossingEdgeQuery::~S2CrossingEdgeQuery(&local_168);
              MutableS2ShapeIndex::~MutableS2ShapeIndex(&local_1c8);
              pPVar12 = (PolygonDegeneracy *)VStack_278.c_[0];
            }
          }
          (__return_storage_ptr__->
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          VStack_278.c_[0] = (VType)pPVar12;
          if (pCVar41 != local_2c8) {
            pSVar13 = (S2Error *)local_288._0_8_;
            do {
              local_288._4_4_ = (undefined4)((ulong)pSVar13 >> 0x20);
              uVar31 = pCVar41->root_sign;
              if (uVar31 == 0) {
                local_288._0_8_ = pSVar13;
                S2LogMessage::S2LogMessage
                          ((S2LogMessage *)local_288,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_find_polygon_degeneracies.cc"
                           ,0x15d,kFatal,(ostream *)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          (stack0xfffffffffffffd80,"Check failed: (component.root_sign) != (0) ",
                           0x2b);
                goto LAB_001cbe06;
              }
              pPVar35 = (pCVar41->degeneracies).
                        super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pPVar8 = (pCVar41->degeneracies).
                       super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (pPVar35 != pPVar8) {
                do {
                  local_288._0_4_ = (uint)*pPVar35 ^ uVar31 & 0x80000000;
                  __position._M_current =
                       (__return_storage_ptr__->
                       super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (__return_storage_ptr__->
                      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                    ::_M_realloc_insert<s2builderutil::PolygonDegeneracy>
                              (__return_storage_ptr__,__position,(PolygonDegeneracy *)local_288);
                  }
                  else {
                    *__position._M_current = (PolygonDegeneracy)local_288._0_4_;
                    ppPVar2 = &(__return_storage_ptr__->
                               super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppPVar2 = *ppPVar2 + 1;
                  }
                  pPVar35 = pPVar35 + 1;
                  pSVar13 = (S2Error *)CONCAT44(local_288._4_4_,local_288._0_4_);
                } while (pPVar35 != pPVar8);
              }
              local_288._0_8_ = pSVar13;
              pCVar41 = pCVar41 + 1;
              pSVar13 = (S2Error *)local_288._0_8_;
            } while (pCVar41 != local_2c8);
            pPVar35 = (__return_storage_ptr__->
                      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pPVar8 = (__return_storage_ptr__->
                     super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            if (pPVar35 != pPVar8) {
              uVar22 = (long)pPVar8 - (long)pPVar35 >> 2;
              lVar28 = 0x3f;
              if (uVar22 != 0) {
                for (; uVar22 >> lVar28 == 0; lVar28 = lVar28 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<s2builderutil::PolygonDegeneracy*,std::vector<s2builderutil::PolygonDegeneracy,std::allocator<s2builderutil::PolygonDegeneracy>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (pPVar35,pPVar8,((uint)lVar28 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<s2builderutil::PolygonDegeneracy*,std::vector<s2builderutil::PolygonDegeneracy,std::allocator<s2builderutil::PolygonDegeneracy>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (pPVar35,pPVar8);
            }
          }
        }
        std::
        vector<s2builderutil::(anonymous_namespace)::Component,_std::allocator<s2builderutil::(anonymous_namespace)::Component>_>
        ::~vector(&local_218);
      }
      goto LAB_001cbce9;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unique0x100025df = (ostream *)CONCAT44(uStack_27c,local_288._8_4_);
  VStack_278.c_[0] = (VType)CONCAT44(VStack_278.c_[0]._4_4_,VStack_278.c_[0]._0_4_);
LAB_001cbce9:
  anon_unknown_0::DegeneracyFinder::~DegeneracyFinder(&local_110);
  return __return_storage_ptr__;
}

Assistant:

vector<PolygonDegeneracy> FindPolygonDegeneracies(const Graph& g,
                                                  S2Error* error) {
  CheckGraphOptions(g);
  if (g.options().degenerate_edges() == DegenerateEdges::DISCARD &&
      g.options().sibling_pairs() == SiblingPairs::DISCARD) {
    return {};  // All degeneracies have already been discarded.
  }
  return DegeneracyFinder(&g).Run(error);
}